

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O1

Gia_Man_t *
Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Bit_t **pvInits,int iFrBeg,int iFrEnd)

{
  uint *puVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int iVar5;
  Vec_Bit_t *pVVar6;
  int *__s;
  void *__s_00;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Gia_Man_t *pGVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  Vec_Int_t *pVVar15;
  char *pcVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  char *__assertion;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  uint local_68;
  
  Gia_ManCleanMark0(p);
  uVar11 = p->nRegs;
  if ((int)uVar11 < 1) {
    uVar19 = 0;
  }
  else {
    uVar23 = 0;
    do {
      iVar28 = p->vCis->nSize;
      uVar19 = (iVar28 - uVar11) + uVar23;
      if (((int)uVar19 < 0) || (iVar28 <= (int)uVar19)) goto LAB_004fb7f9;
      iVar28 = p->vCis->pArray[uVar19];
      lVar21 = (long)iVar28;
      if ((lVar21 < 0) || (p->nObjs <= iVar28)) goto LAB_004fb7da;
      pGVar3 = p->pObjs;
      uVar19 = uVar23;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar19 = uVar23 + 1;
      *(ulong *)(pGVar3 + lVar21) =
           *(ulong *)(pGVar3 + lVar21) & 0xffffffffbfffffff |
           (ulong)(((uint)(&pCex[1].iPo)[uVar23 >> 5] >> ((byte)uVar23 & 0x1f) & 1) << 0x1e);
      uVar11 = p->nRegs;
      uVar23 = uVar19;
    } while ((int)uVar19 < (int)uVar11);
  }
  iVar28 = (((int)uVar11 >> 5) + 1) - (uint)((uVar11 & 0x1f) == 0);
  pVVar6 = (Vec_Bit_t *)malloc(0x10);
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar28 * 0x20;
  if (iVar28 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar28 * 4);
  }
  pVVar6->pArray = __s;
  pVVar6->nSize = iVar28 * 0x20;
  memset(__s,0,(long)iVar28 << 2);
  *pvInits = pVVar6;
  if (iFrEnd < 1) {
    iVar28 = 0;
  }
  else {
    iVar5 = 0;
    do {
      if ((iVar5 == iFrBeg) && (iVar28 = p->nRegs, 0 < iVar28)) {
        pVVar15 = p->vCis;
        uVar11 = 0;
        do {
          iVar12 = pVVar15->nSize;
          uVar23 = (iVar12 - iVar28) + uVar11;
          if (((int)uVar23 < 0) || (iVar12 <= (int)uVar23)) goto LAB_004fb7f9;
          iVar28 = pVVar15->pArray[uVar23];
          if (((long)iVar28 < 0) || (p->nObjs <= iVar28)) goto LAB_004fb7da;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if ((p->pObjs[iVar28].field_0x3 & 0x40) != 0) {
            if ((*pvInits)->nSize <= (int)uVar11) goto LAB_004fb8f1;
            puVar1 = (uint *)((*pvInits)->pArray + (uVar11 >> 5));
            *puVar1 = *puVar1 | 1 << ((byte)uVar11 & 0x1f);
          }
          uVar11 = uVar11 + 1;
          iVar28 = p->nRegs;
        } while ((int)uVar11 < iVar28);
      }
      pVVar15 = p->vCis;
      uVar24 = (ulong)(uint)pVVar15->nSize;
      if (p->nRegs < pVVar15->nSize) {
        lVar21 = 0;
        do {
          if ((int)uVar24 <= lVar21) goto LAB_004fb7f9;
          lVar25 = (long)pVVar15->pArray[lVar21];
          if ((lVar25 < 0) || (p->nObjs <= pVVar15->pArray[lVar21])) goto LAB_004fb7da;
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          *(ulong *)(pGVar3 + lVar25) =
               *(ulong *)(pGVar3 + lVar25) & 0xffffffffbfffffff |
               (ulong)(((uint)(&pCex[1].iPo)[(int)((ulong)uVar19 + lVar21) >> 5] >>
                        ((byte)((ulong)uVar19 + lVar21) & 0x1f) & 1) << 0x1e);
          lVar21 = lVar21 + 1;
          pVVar15 = p->vCis;
          uVar24 = (ulong)pVVar15->nSize;
        } while (lVar21 < (long)(uVar24 - (long)p->nRegs));
        uVar19 = uVar19 + (int)lVar21;
      }
      if (0 < p->nObjs) {
        lVar21 = 0;
        lVar25 = 0;
        do {
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          uVar24 = *(ulong *)(&pGVar3->field_0x0 + lVar21);
          if ((uVar24 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar24) {
            *(ulong *)(&pGVar3->field_0x0 + lVar21) =
                 uVar24 & 0xffffffff3fffffff |
                 (ulong)((((uint)(uVar24 >> 0x3d) ^
                          *(uint *)((long)pGVar3 +
                                   (ulong)((uint)(uVar24 >> 0x1e) & 0x7ffffffc) * -3 + lVar21) >>
                          0x1e) & ((uint)(uVar24 >> 0x1d) & 7 ^
                                  *(uint *)((long)pGVar3 +
                                           (ulong)(uint)((int)(uVar24 & 0x1fffffff) << 2) * -3 +
                                           lVar21) >> 0x1e) & 1) << 0x1e);
          }
          lVar25 = lVar25 + 1;
          lVar21 = lVar21 + 0xc;
        } while (lVar25 < p->nObjs);
      }
      pVVar15 = p->vCos;
      if (0 < pVVar15->nSize) {
        lVar21 = 0;
        do {
          iVar28 = pVVar15->pArray[lVar21];
          if (((long)iVar28 < 0) || (p->nObjs <= iVar28)) goto LAB_004fb7da;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + iVar28;
          uVar11 = (uint)*(ulong *)pGVar3;
          *(ulong *)pGVar3 =
               *(ulong *)pGVar3 & 0xffffffffbfffffff |
               (ulong)((uVar11 * 2 ^ *(uint *)(pGVar3 + -(ulong)(uVar11 & 0x1fffffff))) & 0x40000000
                      );
          lVar21 = lVar21 + 1;
          pVVar15 = p->vCos;
        } while (lVar21 < pVVar15->nSize);
      }
      iVar28 = p->nRegs;
      if (0 < iVar28) {
        iVar12 = 0;
        do {
          iVar14 = p->vCos->nSize;
          uVar11 = (iVar14 - iVar28) + iVar12;
          if (((int)uVar11 < 0) || (iVar14 <= (int)uVar11)) goto LAB_004fb7f9;
          iVar14 = p->vCos->pArray[uVar11];
          if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_004fb7da;
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          iVar2 = p->vCis->nSize;
          uVar11 = (iVar2 - iVar28) + iVar12;
          if (((int)uVar11 < 0) || (iVar2 <= (int)uVar11)) goto LAB_004fb7f9;
          iVar28 = p->vCis->pArray[uVar11];
          lVar21 = (long)iVar28;
          if ((lVar21 < 0) || (p->nObjs <= iVar28)) goto LAB_004fb7da;
          *(ulong *)(pGVar3 + lVar21) =
               *(ulong *)(pGVar3 + lVar21) & 0xffffffffbfffffff |
               (ulong)((uint)*(undefined8 *)(pGVar3 + iVar14) & 0x40000000);
          iVar12 = iVar12 + 1;
          iVar28 = p->nRegs;
        } while (iVar12 < iVar28);
      }
      iVar5 = iVar5 + 1;
      iVar28 = iFrEnd;
    } while (iVar5 != iFrEnd);
  }
  if (iVar28 != iFrEnd) {
    __assertion = "i == iFrEnd";
    pcVar8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexCut.c"
    ;
    pcVar16 = 
    "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)";
LAB_004fb8a9:
    __assert_fail(__assertion,pcVar8,0x10b,pcVar16);
  }
  iVar28 = ((p->nRegs >> 5) + 1) - (uint)((p->nRegs & 0x1fU) == 0);
  if (iVar28 == 0) {
    __s_00 = (void *)0x0;
  }
  else {
    __s_00 = malloc((long)iVar28 * 4);
  }
  uVar23 = iVar28 * 0x20;
  uVar27 = 0;
  memset(__s_00,0,(long)iVar28 << 2);
  uVar11 = p->nRegs;
  if (0 < (int)uVar11) {
    pVVar15 = p->vCis;
    do {
      iVar28 = pVVar15->nSize;
      uVar13 = (uVar27 - uVar11) + iVar28;
      if (((int)uVar13 < 0) || (iVar28 <= (int)uVar13)) goto LAB_004fb7f9;
      iVar28 = pVVar15->pArray[uVar13];
      if (((long)iVar28 < 0) || (p->nObjs <= iVar28)) goto LAB_004fb7da;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if ((p->pObjs[iVar28].field_0x3 & 0x40) != 0) {
        if ((int)uVar23 <= (int)uVar27) {
LAB_004fb8f1:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecBit.h"
                        ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
        }
        puVar1 = (uint *)((long)__s_00 + (ulong)(uVar27 >> 5) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)uVar27 & 0x1f);
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 != uVar11);
  }
  p_00 = Gia_ManStart(10000);
  pcVar16 = p->pName;
  if (pcVar16 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar16);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar16);
  }
  p_00->pName = pcVar8;
  iVar28 = p->nRegs;
  if (0 < iVar28) {
    iVar5 = 0;
    do {
      iVar12 = p->vCis->nSize;
      uVar11 = (iVar12 - iVar28) + iVar5;
      if (((int)uVar11 < 0) || (iVar12 <= (int)uVar11)) goto LAB_004fb7f9;
      iVar28 = p->vCis->pArray[uVar11];
      if ((iVar28 < 0) || (p->nObjs <= iVar28)) goto LAB_004fb7da;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar24 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar24 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar24 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_00->pObjs;
      if ((pGVar9 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar9)) {
LAB_004fb856:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * -0x55555555);
      if ((pGVar9 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar9)) goto LAB_004fb856;
      iVar5 = iVar5 + 1;
      iVar28 = p->nRegs;
    } while (iVar5 < iVar28);
  }
  Gia_ManHashStart(p_00);
  pGVar3 = p->pObjs;
  pGVar3->Value = 1;
  pVVar15 = p->vCis;
  uVar11 = pVVar15->nSize;
  uVar27 = uVar11 - p->nRegs;
  if (uVar27 != 0 && p->nRegs <= (int)uVar11) {
    uVar18 = 0;
    uVar24 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar24 = uVar18;
    }
    do {
      if (uVar24 == uVar18) goto LAB_004fb7f9;
      iVar28 = pVVar15->pArray[uVar18];
      if (((long)iVar28 < 0) || (p->nObjs <= iVar28)) goto LAB_004fb7da;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar3[iVar28].Value = 1;
      uVar18 = uVar18 + 1;
    } while (uVar27 != uVar18);
  }
  if (iFrEnd <= pCex->iFrame) {
    iVar28 = iFrEnd;
    if ((int)uVar23 < 1) {
      uVar23 = 0;
    }
    do {
      iVar5 = p->nRegs;
      if (0 < iVar5) {
        uVar11 = 0;
        do {
          iVar12 = p->vCis->nSize;
          uVar27 = (iVar12 - iVar5) + uVar11;
          if (((int)uVar27 < 0) || (iVar12 <= (int)uVar27)) goto LAB_004fb7f9;
          iVar5 = p->vCis->pArray[uVar27];
          if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_004fb7da;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (uVar23 == uVar11) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecBit.h"
                          ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
          }
          pGVar3 = p->pObjs + iVar5;
          *(ulong *)pGVar3 =
               *(ulong *)pGVar3 & 0xffffffffbfffffff |
               (ulong)((*(uint *)((long)__s_00 + (ulong)(uVar11 >> 5) * 4) >> ((byte)uVar11 & 0x1f)
                       & 1) << 0x1e);
          uVar11 = uVar11 + 1;
          iVar5 = p->nRegs;
        } while ((int)uVar11 < iVar5);
      }
      iVar5 = iFrEnd;
      local_68 = uVar19;
      if (iFrEnd < iVar28) {
        do {
          pVVar15 = p->vCis;
          uVar24 = (ulong)(uint)pVVar15->nSize;
          if (p->nRegs < pVVar15->nSize) {
            lVar21 = 0;
            do {
              if ((int)uVar24 <= lVar21) goto LAB_004fb7f9;
              lVar25 = (long)pVVar15->pArray[lVar21];
              if ((lVar25 < 0) || (p->nObjs <= pVVar15->pArray[lVar21])) goto LAB_004fb7da;
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) break;
              *(ulong *)(pGVar3 + lVar25) =
                   *(ulong *)(pGVar3 + lVar25) & 0xffffffffbfffffff |
                   (ulong)(((uint)(&pCex[1].iPo)[(int)((ulong)local_68 + lVar21) >> 5] >>
                            ((byte)((ulong)local_68 + lVar21) & 0x1f) & 1) << 0x1e);
              lVar21 = lVar21 + 1;
              pVVar15 = p->vCis;
              uVar24 = (ulong)pVVar15->nSize;
            } while (lVar21 < (long)(uVar24 - (long)p->nRegs));
            local_68 = local_68 + (int)lVar21;
          }
          if (0 < p->nObjs) {
            lVar21 = 0;
            lVar25 = 0;
            do {
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) break;
              uVar24 = *(ulong *)(&pGVar3->field_0x0 + lVar21);
              if ((uVar24 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar24) {
                *(ulong *)(&pGVar3->field_0x0 + lVar21) =
                     uVar24 & 0xffffffff3fffffff |
                     (ulong)((((uint)(uVar24 >> 0x3d) ^
                              *(uint *)((long)pGVar3 +
                                       (ulong)((uint)(uVar24 >> 0x1e) & 0x7ffffffc) * -3 + lVar21)
                              >> 0x1e) &
                              ((uint)(uVar24 >> 0x1d) & 7 ^
                              *(uint *)((long)pGVar3 +
                                       (ulong)(uint)((int)(uVar24 & 0x1fffffff) << 2) * -3 + lVar21)
                              >> 0x1e) & 1) << 0x1e);
              }
              lVar25 = lVar25 + 1;
              lVar21 = lVar21 + 0xc;
            } while (lVar25 < p->nObjs);
          }
          pVVar15 = p->vCos;
          if (0 < pVVar15->nSize) {
            lVar21 = 0;
            do {
              iVar12 = pVVar15->pArray[lVar21];
              if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_004fb7da;
              if (p->pObjs == (Gia_Obj_t *)0x0) break;
              pGVar3 = p->pObjs + iVar12;
              uVar11 = (uint)*(ulong *)pGVar3;
              *(ulong *)pGVar3 =
                   *(ulong *)pGVar3 & 0xffffffffbfffffff |
                   (ulong)((uVar11 * 2 ^ *(uint *)(pGVar3 + -(ulong)(uVar11 & 0x1fffffff))) &
                          0x40000000);
              lVar21 = lVar21 + 1;
              pVVar15 = p->vCos;
            } while (lVar21 < pVVar15->nSize);
          }
          iVar12 = p->nRegs;
          if (0 < iVar12) {
            iVar14 = 0;
            do {
              iVar2 = p->vCos->nSize;
              uVar11 = (iVar2 - iVar12) + iVar14;
              if (((int)uVar11 < 0) || (iVar2 <= (int)uVar11)) goto LAB_004fb7f9;
              iVar2 = p->vCos->pArray[uVar11];
              if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_004fb7da;
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) break;
              iVar26 = p->vCis->nSize;
              uVar11 = (iVar26 - iVar12) + iVar14;
              if (((int)uVar11 < 0) || (iVar26 <= (int)uVar11)) goto LAB_004fb7f9;
              iVar12 = p->vCis->pArray[uVar11];
              lVar21 = (long)iVar12;
              if ((lVar21 < 0) || (p->nObjs <= iVar12)) goto LAB_004fb7da;
              *(ulong *)(pGVar3 + lVar21) =
                   *(ulong *)(pGVar3 + lVar21) & 0xffffffffbfffffff |
                   (ulong)((uint)*(undefined8 *)(pGVar3 + iVar2) & 0x40000000);
              iVar14 = iVar14 + 1;
              iVar12 = p->nRegs;
            } while (iVar14 < iVar12);
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 != iVar28);
      }
      iVar5 = p->nRegs;
      if (0 < (long)iVar5) {
        pVVar15 = p->vCis;
        iVar12 = pVVar15->nSize;
        uVar24 = (ulong)(uint)(iVar12 - iVar5);
        lVar21 = 0;
        do {
          if (((int)uVar24 < 0) || (iVar12 <= (int)uVar24)) goto LAB_004fb7f9;
          iVar14 = pVVar15->pArray[uVar24];
          if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_004fb7da;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          lVar25 = (long)p_00->vCis->nSize;
          if (lVar25 - p_00->nRegs <= lVar21) {
            __assert_fail("v < Gia_ManPiNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1a6,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
          }
          if (lVar25 <= lVar21) goto LAB_004fb7f9;
          iVar2 = p_00->vCis->pArray[lVar21];
          if (((long)iVar2 < 0) || (p_00->nObjs <= iVar2)) goto LAB_004fb7da;
          pGVar3 = p_00->pObjs;
          pGVar9 = (Gia_Obj_t *)((ulong)(pGVar3 + iVar2) & 0xfffffffffffffffe);
          if ((pGVar9 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar9)) goto LAB_004fb856;
          iVar26 = (int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2);
          if (iVar26 * -0x55555555 < 0) {
            __assertion = "Var >= 0 && !(c >> 1)";
            pcVar8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
            ;
            pcVar16 = "int Abc_Var2Lit(int, int)";
            goto LAB_004fb8a9;
          }
          pGVar9 = p->pObjs + iVar14;
          pGVar9->Value =
               (uint)((*(uint *)pGVar9 >> 0x1e & 1) == 0) ^
               ((uint)(pGVar3 + iVar2) & 1) + iVar26 * 0x55555556;
          lVar21 = lVar21 + 1;
          uVar24 = uVar24 + 1;
        } while (iVar5 != lVar21);
      }
      iVar5 = iVar28;
      if (iVar28 <= pCex->iFrame) {
        do {
          pVVar15 = p->vCis;
          uVar24 = (ulong)(uint)pVVar15->nSize;
          if (p->nRegs < pVVar15->nSize) {
            lVar21 = 0;
            do {
              if ((int)uVar24 <= lVar21) goto LAB_004fb7f9;
              lVar25 = (long)pVVar15->pArray[lVar21];
              if ((lVar25 < 0) || (p->nObjs <= pVVar15->pArray[lVar21])) goto LAB_004fb7da;
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) break;
              *(ulong *)(pGVar3 + lVar25) =
                   *(ulong *)(pGVar3 + lVar25) & 0xffffffffbfffffff |
                   (ulong)(((uint)(&pCex[1].iPo)[(int)((ulong)local_68 + lVar21) >> 5] >>
                            ((byte)((ulong)local_68 + lVar21) & 0x1f) & 1) << 0x1e);
              lVar21 = lVar21 + 1;
              pVVar15 = p->vCis;
              uVar24 = (ulong)pVVar15->nSize;
            } while (lVar21 < (long)(uVar24 - (long)p->nRegs));
            local_68 = local_68 + (int)lVar21;
          }
          if (0 < p->nObjs) {
            lVar25 = 8;
            lVar21 = 0;
            do {
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) break;
              uVar24 = *(ulong *)((long)pGVar3 + lVar25 + -8);
              uVar11 = (uint)uVar24;
              if ((uVar24 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar11) {
                uVar13 = (uint)(uVar24 >> 0x1d) & 7 ^
                         *(uint *)((long)pGVar3 +
                                  (ulong)(uint)((int)(uVar24 & 0x1fffffff) << 2) * -3 + lVar25 + -8)
                         >> 0x1e;
                uVar27 = (uint)(uVar24 >> 0x1e);
                uVar17 = *(uint *)((long)pGVar3 + (ulong)(uVar27 & 0x7ffffffc) * -3 + lVar25 + -8)
                         >> 0x1e & 1;
                uVar20 = (uint)(uVar24 >> 0x3d) & 1;
                uVar22 = (uVar17 ^ uVar20) & uVar13;
                *(ulong *)((long)pGVar3 + lVar25 + -8) =
                     uVar24 & 0xffffffff3fffffff | (ulong)(uVar22 << 0x1e);
                if (uVar22 == 0) {
                  if (((uVar13 & 1) == 0) && (uVar17 == uVar20)) {
                    iVar12 = Gia_ManHashOr(p_00,*(int *)((long)pGVar3 +
                                                        lVar25 + (ulong)((uVar11 & 0x1fffffff) << 2)
                                                                 * -3),
                                           *(int *)((long)pGVar3 +
                                                   lVar25 + (ulong)(uVar27 & 0x7ffffffc) * -3));
                  }
                  else {
                    if ((uVar13 & 1) == 0) {
                      uVar27 = (uVar11 & 0x1fffffff) << 2;
                    }
                    else {
                      if (uVar17 != uVar20) {
                        __assert_fail("0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexCut.c"
                                      ,0x144,
                                      "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                                     );
                      }
                      uVar27 = uVar27 & 0x7ffffffc;
                    }
                    iVar12 = *(int *)((long)pGVar3 + lVar25 + (ulong)uVar27 * -3);
                  }
                }
                else {
                  iVar12 = Gia_ManHashAnd(p_00,*(int *)((long)pGVar3 +
                                                       lVar25 + (ulong)((uVar11 & 0x1fffffff) << 2)
                                                                * -3),
                                          *(int *)((long)pGVar3 +
                                                  lVar25 + (ulong)(uVar27 & 0x7ffffffc) * -3));
                }
                *(int *)(&pGVar3->field_0x0 + lVar25) = iVar12;
                if (iVar12 == 0) {
                  __assert_fail("pObj->Value > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexCut.c"
                                ,0x145,
                                "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                               );
                }
              }
              lVar21 = lVar21 + 1;
              lVar25 = lVar25 + 0xc;
            } while (lVar21 < p->nObjs);
          }
          pVVar15 = p->vCos;
          if (0 < pVVar15->nSize) {
            lVar21 = 0;
            do {
              iVar12 = pVVar15->pArray[lVar21];
              if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_004fb7da;
              if (p->pObjs == (Gia_Obj_t *)0x0) break;
              pGVar3 = p->pObjs + iVar12;
              uVar11 = (uint)*(ulong *)pGVar3;
              uVar24 = (ulong)(uVar11 & 0x1fffffff);
              *(ulong *)pGVar3 =
                   *(ulong *)pGVar3 & 0xffffffffbfffffff |
                   (ulong)((uVar11 * 2 ^ *(uint *)(pGVar3 + -uVar24)) & 0x40000000);
              uVar11 = pGVar3[-uVar24].Value;
              pGVar3->Value = uVar11;
              if (uVar11 == 0) {
                __assert_fail("pObj->Value > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexCut.c"
                              ,0x14b,
                              "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                             );
              }
              lVar21 = lVar21 + 1;
              pVVar15 = p->vCos;
            } while (lVar21 < pVVar15->nSize);
          }
          if (iVar5 == pCex->iFrame) break;
          iVar12 = p->nRegs;
          if (0 < iVar12) {
            iVar14 = 0;
            do {
              iVar2 = p->vCos->nSize;
              uVar11 = (iVar2 - iVar12) + iVar14;
              if (((int)uVar11 < 0) || (iVar2 <= (int)uVar11)) goto LAB_004fb7f9;
              iVar2 = p->vCos->pArray[uVar11];
              if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_004fb7da;
              pGVar3 = p->pObjs;
              if (pGVar3 == (Gia_Obj_t *)0x0) break;
              iVar26 = p->vCis->nSize;
              uVar11 = (iVar26 - iVar12) + iVar14;
              if (((int)uVar11 < 0) || (iVar26 <= (int)uVar11)) goto LAB_004fb7f9;
              iVar12 = p->vCis->pArray[uVar11];
              lVar21 = (long)iVar12;
              if ((lVar21 < 0) || (p->nObjs <= iVar12)) goto LAB_004fb7da;
              *(ulong *)(pGVar3 + lVar21) =
                   *(ulong *)(pGVar3 + lVar21) & 0xffffffffbfffffff |
                   (ulong)((uint)*(undefined8 *)(pGVar3 + iVar2) & 0x40000000);
              pGVar3[lVar21].Value = pGVar3[iVar2].Value;
              iVar14 = iVar14 + 1;
              iVar12 = p->nRegs;
            } while (iVar14 < iVar12);
          }
          bVar4 = iVar5 < pCex->iFrame;
          iVar5 = iVar5 + 1;
        } while (bVar4);
      }
      if (local_68 != pCex->nBits) {
        __assert_fail("iBit == pCex->nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexCut.c"
                      ,0x155,
                      "Gia_Man_t *Bmc_GiaGenerateGiaAllFrames(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                     );
      }
      uVar11 = pCex->iPo;
      iVar5 = p->vCos->nSize;
      if (iVar5 - p->nRegs <= (int)uVar11) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (((int)uVar11 < 0) || (iVar5 <= (int)uVar11)) {
LAB_004fb7f9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = p->vCos->pArray[uVar11];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_004fb7da:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      Gia_ManAppendCo(p_00,p->pObjs[iVar5].Value);
      bVar4 = iVar28 < pCex->iFrame;
      iVar28 = iVar28 + 1;
    } while (bVar4);
  }
  Gia_ManHashStop(p_00);
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  pGVar10 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar10;
}

Assistant:

Gia_Man_t * Bmc_GiaGenerateGiaAllFrames( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Bit_t ** pvInits, int iFrBeg, int iFrEnd )
{
    Vec_Bit_t * vInitEnd;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int f, i, k, iBitOld, iBit = 0, fCompl0, fCompl1;

    // skip trough the first iFrEnd frames
    Gia_ManCleanMark0(p);
    Gia_ManForEachRo( p, pObj, k )
        pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
    *pvInits = Vec_BitStart( Gia_ManRegNum(p) );
    for ( i = 0; i < iFrEnd; i++ )
    {
        // remember values in frame iFrBeg
        if ( i == iFrBeg )
            Gia_ManForEachRo( p, pObjRo, k )
                if ( pObjRo->fMark0 )
                    Vec_BitWriteEntry( *pvInits, k, 1 );
        // simulate other values
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachAnd( p, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( p, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
    assert( i == iFrEnd );
    vInitEnd = Vec_BitStart( Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObjRo, k )
        if ( pObjRo->fMark0 )
            Vec_BitWriteEntry( vInitEnd, k, 1 );

    // create new AIG manager
    pNew = Gia_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManForEachRo( p, pObjRo, k )
        Gia_ManAppendCi(pNew);
    Gia_ManHashStart( pNew );

    Gia_ManConst0(p)->Value = 1;
    Gia_ManForEachPi( p, pObj, k )
        pObj->Value = 1;

    iBitOld = iBit;
    for ( f = iFrEnd; f <= pCex->iFrame; f++ )
    {
        // set up correct init state
        Gia_ManForEachRo( p, pObjRo, k )
            pObjRo->fMark0 = Vec_BitEntry( vInitEnd, k );
        // simulate it for a few frames
        iBit = iBitOld;
        for ( i = iFrEnd; i < f; i++ )
        {
            Gia_ManForEachPi( p, pObj, k )
                pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
            Gia_ManForEachAnd( p, pObj, k )
                pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                               (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
            Gia_ManForEachCo( p, pObj, k )
                pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
                pObjRo->fMark0 = pObjRi->fMark0;
        }
        // start creating values
        Gia_ManForEachRo( p, pObjRo, k )
            pObjRo->Value = Abc_LitNotCond( Gia_Obj2Lit(pNew, Gia_ManPi(pNew, k)), !pObjRo->fMark0 );
        for ( i = f; i <= pCex->iFrame; i++ )
        {
            Gia_ManForEachPi( p, pObj, k )
                pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
            Gia_ManForEachAnd( p, pObj, k )
            {
                fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
                pObj->fMark0 = fCompl0 & fCompl1;
                if ( pObj->fMark0 )
                    pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
                else if ( !fCompl0 && !fCompl1 )
                    pObj->Value = Gia_ManHashOr( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
                else if ( !fCompl0 )
                    pObj->Value = Gia_ObjFanin0(pObj)->Value;
                else if ( !fCompl1 )
                    pObj->Value = Gia_ObjFanin1(pObj)->Value;
                else assert( 0 );
                assert( pObj->Value > 0 );
            }
            Gia_ManForEachCo( p, pObj, k )
            {
                pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
                pObj->Value = Gia_ObjFanin0(pObj)->Value;
                assert( pObj->Value > 0 );
            } 
            if ( i == pCex->iFrame )
                break;
            Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            {
                pObjRo->fMark0 = pObjRi->fMark0;
                pObjRo->Value = pObjRi->Value;
            }
        }
        assert( iBit == pCex->nBits );
        // create PO
        Gia_ManAppendCo( pNew, Gia_ManPo(p, pCex->iPo)->Value );
    }
    Gia_ManHashStop( pNew );
    Vec_BitFree( vInitEnd );

    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}